

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::AtomicCounterBufferStorageTestCase::AtomicCounterBufferStorageTestCase
          (AtomicCounterBufferStorageTestCase *this,Functions *gl,TestContext *testContext,
          GLint page_size,bool all_pages_committed)

{
  bool all_pages_committed_local;
  GLint page_size_local;
  TestContext *testContext_local;
  Functions *gl_local;
  AtomicCounterBufferStorageTestCase *this_local;
  
  BufferStorageTestCase::BufferStorageTestCase(&this->super_BufferStorageTestCase);
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__AtomicCounterBufferStorageTestCase_0323c8a0;
  this->m_all_pages_committed = all_pages_committed;
  this->m_gl = gl;
  this->m_gl_atomic_counter_uniform_array_stride = 0;
  this->m_gl_max_vertex_atomic_counters_value = 0;
  this->m_helper_bo = 0;
  this->m_helper_bo_size = 0;
  this->m_helper_bo_size_rounded = 0;
  this->m_n_draw_calls = 3;
  this->m_page_size = page_size;
  this->m_po = 0;
  this->m_sparse_bo = 0;
  this->m_sparse_bo_data_size = 0;
  this->m_sparse_bo_data_size_rounded = 0;
  this->m_sparse_bo_data_start_offset = 0;
  this->m_sparse_bo_data_start_offset_rounded = 0;
  this->m_testCtx = testContext;
  this->m_vao = 0;
  return;
}

Assistant:

AtomicCounterBufferStorageTestCase::AtomicCounterBufferStorageTestCase(const glw::Functions& gl,
																	   tcu::TestContext&	 testContext,
																	   glw::GLint page_size, bool all_pages_committed)
	: m_all_pages_committed(all_pages_committed)
	, m_gl(gl)
	, m_gl_atomic_counter_uniform_array_stride(0)
	, m_gl_max_vertex_atomic_counters_value(0)
	, m_helper_bo(0)
	, m_helper_bo_size(0)
	, m_helper_bo_size_rounded(0)
	, m_n_draw_calls(3) /* as per test spec */
	, m_page_size(page_size)
	, m_po(0)
	, m_sparse_bo(0)
	, m_sparse_bo_data_size(0)
	, m_sparse_bo_data_size_rounded(0)
	, m_sparse_bo_data_start_offset(0)
	, m_sparse_bo_data_start_offset_rounded(0)
	, m_testCtx(testContext)
	, m_vao(0)
{
	/* Left blank intentionally */
}